

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ber_tlv_length.c
# Opt level: O0

ssize_t ber_skip_length(asn_codec_ctx_t *opt_codec_ctx,int _is_constructed,void *ptr,size_t size)

{
  int iVar1;
  char *ptr_00;
  void *ptr_01;
  size_t in_RCX;
  void *in_RDX;
  int in_ESI;
  ber_tlv_tag_t tag;
  size_t skip;
  ssize_t ll;
  ssize_t tl;
  ber_tlv_len_t vlen;
  asn_codec_ctx_t *in_stack_ffffffffffffffa8;
  ber_tlv_tag_t local_4c;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  size_t in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffe8;
  ulong local_8;
  
  iVar1 = ASN__STACK_OVERFLOW_CHECK(in_stack_ffffffffffffffa8);
  if (iVar1 == 0) {
    local_40 = ber_fetch_length(in_ESI,in_RDX,in_RCX,(ber_tlv_len_t *)&stack0xffffffffffffffd0);
    local_8 = local_40;
    if (0 < (long)local_40) {
      if ((long)in_stack_ffffffffffffffd0 < 0) {
        ASN_DEBUG("Skipping indefinite length");
        local_48 = local_40;
        ptr_00 = (char *)((long)in_RDX + local_40);
        ptr_01 = (void *)(in_RCX - local_40);
        while (((local_38 = ber_fetch_tag(ptr_00,(size_t)ptr_01,&local_4c), local_8 = local_38,
                0 < (long)local_38 &&
                (local_40 = ber_skip_length((asn_codec_ctx_t *)
                                            CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                                            (int)((ulong)ptr_00 >> 0x20),ptr_01,
                                            in_stack_ffffffffffffffd0), local_8 = local_40,
                0 < (long)local_40)) &&
               ((local_48 = local_38 + local_40 + local_48, *ptr_00 != '\0' ||
                (local_8 = local_48, ptr_00[1] != '\0'))))) {
          ptr_00 = ptr_00 + local_40 + local_38;
          ptr_01 = (void *)((long)ptr_01 - (local_38 + local_40));
        }
      }
      else {
        local_8 = local_40 + in_stack_ffffffffffffffd0;
        if (in_RCX < local_8) {
          local_8 = 0;
        }
      }
    }
  }
  else {
    local_8 = 0xffffffffffffffff;
  }
  return local_8;
}

Assistant:

ssize_t
ber_skip_length(asn_codec_ctx_t *opt_codec_ctx,
		int _is_constructed, const void *ptr, size_t size) {
	ber_tlv_len_t vlen;	/* Length of V in TLV */
	ssize_t tl;		/* Length of L in TLV */
	ssize_t ll;		/* Length of L in TLV */
	size_t skip;

	/*
	 * Make sure we didn't exceed the maximum stack size.
	 */
	if(ASN__STACK_OVERFLOW_CHECK(opt_codec_ctx))
		return -1;

	/*
	 * Determine the size of L in TLV.
	 */
	ll = ber_fetch_length(_is_constructed, ptr, size, &vlen);
	if(ll <= 0) return ll;

	/*
	 * Definite length.
	 */
	if(vlen >= 0) {
		skip = ll + vlen;
		if(skip > size)
			return 0;	/* Want more */
		return skip;
	}

	/*
	 * Indefinite length!
	 */
	ASN_DEBUG("Skipping indefinite length");
	for(skip = ll, ptr = ((const char *)ptr) + ll, size -= ll;;) {
		ber_tlv_tag_t tag;

		/* Fetch the tag */
		tl = ber_fetch_tag(ptr, size, &tag);
		if(tl <= 0) return tl;

		ll = ber_skip_length(opt_codec_ctx,
			BER_TLV_CONSTRUCTED(ptr),
			((const char *)ptr) + tl, size - tl);
		if(ll <= 0) return ll;

		skip += tl + ll;

		/*
		 * This may be the end of the indefinite length structure,
		 * two consecutive 0 octets.
		 * Check if it is true.
		 */
		if(((const uint8_t *)ptr)[0] == 0
		&& ((const uint8_t *)ptr)[1] == 0)
			return skip;

		ptr = ((const char *)ptr) + tl + ll;
		size -= tl + ll;
 	}

	/* UNREACHABLE */
}